

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbMfs.c
# Opt level: O0

Cnf_Dat_t * Acb_NtkWindow2Cnf(Acb_Ntk_t *p,Vec_Int_t *vWinObjs,int Pivot)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  Vec_Int_t *p_00;
  Vec_Wec_t *p_01;
  Vec_Int_t *p_02;
  Vec_Int_t *p_03;
  Vec_Int_t *pVVar9;
  Cnf_Dat_t *pCVar10;
  int **ppiVar11;
  int *piVar12;
  int local_84;
  int nVars;
  Vec_Int_t *vLits;
  Vec_Int_t *vClas;
  Vec_Wec_t *vCnfs;
  int Entry;
  int *pFanins;
  int iFanin;
  int iObjLit;
  int iObj;
  int k;
  int i;
  int nVarsAll;
  int nTfoSize;
  int TfoStart;
  int nRoots;
  int PivotVar;
  Vec_Int_t *vFaninVars;
  Cnf_Dat_t *pCnf;
  int Pivot_local;
  Vec_Int_t *vWinObjs_local;
  Acb_Ntk_t *p_local;
  
  p_00 = Vec_IntAlloc(8);
  iVar1 = Abc_Var2Lit(Pivot,0);
  iVar1 = Vec_IntFind(vWinObjs,iVar1);
  iVar2 = Acb_NtkCountRoots(vWinObjs,iVar1);
  iVar3 = iVar1 + 1;
  iVar4 = Vec_IntSize(vWinObjs);
  iVar4 = iVar4 - iVar3;
  iVar5 = Vec_IntSize(vWinObjs);
  iVar5 = iVar5 + iVar4 + iVar2;
  p_01 = Acb_DeriveCnfForWindow(p,vWinObjs,iVar1);
  p_02 = Vec_IntAlloc(100);
  p_03 = Vec_IntAlloc(1000);
  for (iObj = 0; iVar6 = Vec_IntSize(vWinObjs), iObj < iVar6; iObj = iObj + 1) {
    iVar6 = Vec_IntEntry(vWinObjs,iObj);
    iVar6 = Abc_Lit2Var(iVar6);
    Acb_ObjSetFunc(p,iVar6,iObj);
  }
  iVar6 = Vec_IntSize(p_03);
  Vec_IntPush(p_02,iVar6);
  for (iObj = 0; iVar7 = Vec_IntSize(vWinObjs), iVar6 = iVar3, iObj < iVar7; iObj = iObj + 1) {
    iVar6 = Vec_IntEntry(vWinObjs,iObj);
    iVar7 = Abc_LitIsCompl(iVar6);
    if ((iVar7 == 0) || (iVar1 <= iObj)) {
      iVar6 = Abc_Lit2Var(iVar6);
      iVar7 = Acb_ObjIsCio(p,iVar6);
      if (iVar7 != 0) {
        __assert_fail("!Acb_ObjIsCio(p, iObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbMfs.c"
                      ,0xd5,"Cnf_Dat_t *Acb_NtkWindow2Cnf(Acb_Ntk_t *, Vec_Int_t *, int)");
      }
      Vec_IntClear(p_00);
      iObjLit = 0;
      piVar12 = Acb_ObjFanins(p,iVar6);
      for (; iObjLit < *piVar12; iObjLit = iObjLit + 1) {
        iVar7 = Acb_ObjFunc(p,piVar12[iObjLit + 1]);
        Vec_IntPush(p_00,iVar7);
      }
      iVar7 = Acb_ObjFunc(p,iVar6);
      Vec_IntPush(p_00,iVar7);
      pVVar9 = Vec_WecEntry(p_01,iVar6);
      Acb_TranslateCnf(p_02,p_03,(Vec_Str_t *)pVVar9,p_00,-1);
    }
  }
  while (iObj = iVar6, iVar6 = Vec_IntSize(vWinObjs), iObj < iVar6) {
    iVar6 = Vec_IntEntry(vWinObjs,iObj);
    iVar6 = Abc_Lit2Var(iVar6);
    iVar7 = Acb_ObjIsCio(p,iVar6);
    if (iVar7 != 0) {
      __assert_fail("!Acb_ObjIsCio(p, iObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbMfs.c"
                    ,0xe2,"Cnf_Dat_t *Acb_NtkWindow2Cnf(Acb_Ntk_t *, Vec_Int_t *, int)");
    }
    Vec_IntClear(p_00);
    iObjLit = 0;
    piVar12 = Acb_ObjFanins(p,iVar6);
    for (; iObjLit < *piVar12; iObjLit = iObjLit + 1) {
      iVar7 = piVar12[iObjLit + 1];
      iVar8 = Acb_ObjFunc(p,iVar7);
      iVar7 = Acb_ObjFunc(p,iVar7);
      Vec_IntPush(p_00,iVar8 + (uint)(iVar1 < iVar7) * iVar4);
    }
    iVar7 = Acb_ObjFunc(p,iVar6);
    Vec_IntPush(p_00,iVar7 + iVar4);
    pVVar9 = Vec_WecEntry(p_01,iVar6);
    Acb_TranslateCnf(p_02,p_03,(Vec_Str_t *)pVVar9,p_00,iVar1);
    iVar6 = iObj + 1;
  }
  if (0 < iVar2) {
    local_84 = Vec_IntSize(vWinObjs);
    local_84 = local_84 + iVar4;
    Vec_IntClear(p_00);
    for (iObj = iVar3; iVar1 = Vec_IntSize(vWinObjs), iObj < iVar1; iObj = iObj + 1) {
      iVar1 = Vec_IntEntry(vWinObjs,iObj);
      iVar3 = Abc_LitIsCompl(iVar1);
      if (iVar3 != 0) {
        iVar1 = Abc_Lit2Var(iVar1);
        iVar3 = Acb_ObjFunc(p,iVar1);
        iVar3 = Abc_Var2Lit(iVar3,1);
        iVar6 = Acb_ObjFunc(p,iVar1);
        iVar6 = Abc_Var2Lit(iVar6 + iVar4,0);
        iVar7 = Abc_Var2Lit(local_84,0);
        Vec_IntPushThree(p_03,iVar3,iVar6,iVar7);
        iVar3 = Vec_IntSize(p_03);
        Vec_IntPush(p_02,iVar3);
        iVar3 = Acb_ObjFunc(p,iVar1);
        iVar3 = Abc_Var2Lit(iVar3,0);
        iVar6 = Acb_ObjFunc(p,iVar1);
        iVar6 = Abc_Var2Lit(iVar6 + iVar4,1);
        iVar7 = Abc_Var2Lit(local_84,0);
        Vec_IntPushThree(p_03,iVar3,iVar6,iVar7);
        iVar3 = Vec_IntSize(p_03);
        Vec_IntPush(p_02,iVar3);
        iVar3 = Acb_ObjFunc(p,iVar1);
        iVar3 = Abc_Var2Lit(iVar3,0);
        iVar6 = Acb_ObjFunc(p,iVar1);
        iVar6 = Abc_Var2Lit(iVar6 + iVar4,0);
        iVar7 = Abc_Var2Lit(local_84,1);
        Vec_IntPushThree(p_03,iVar3,iVar6,iVar7);
        iVar3 = Vec_IntSize(p_03);
        Vec_IntPush(p_02,iVar3);
        iVar3 = Acb_ObjFunc(p,iVar1);
        iVar3 = Abc_Var2Lit(iVar3,1);
        iVar1 = Acb_ObjFunc(p,iVar1);
        iVar1 = Abc_Var2Lit(iVar1 + iVar4,1);
        iVar6 = Abc_Var2Lit(local_84,1);
        Vec_IntPushThree(p_03,iVar3,iVar1,iVar6);
        iVar1 = Vec_IntSize(p_03);
        Vec_IntPush(p_02,iVar1);
        iVar1 = Abc_Var2Lit(local_84,0);
        Vec_IntPush(p_00,iVar1);
        local_84 = local_84 + 1;
      }
    }
    Vec_IntAppend(p_03,p_00);
    iVar1 = Vec_IntSize(p_03);
    Vec_IntPush(p_02,iVar1);
    iVar1 = Vec_IntSize(p_00);
    if (iVar2 != iVar1) {
      __assert_fail("nRoots == Vec_IntSize(vFaninVars)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbMfs.c"
                    ,0x102,"Cnf_Dat_t *Acb_NtkWindow2Cnf(Acb_Ntk_t *, Vec_Int_t *, int)");
    }
    if (local_84 != iVar5) {
      __assert_fail("nVars == nVarsAll",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbMfs.c"
                    ,0x103,"Cnf_Dat_t *Acb_NtkWindow2Cnf(Acb_Ntk_t *, Vec_Int_t *, int)");
    }
  }
  Vec_IntFree(p_00);
  pCVar10 = (Cnf_Dat_t *)calloc(1,0x48);
  pCVar10->nVars = iVar5;
  iVar1 = Vec_IntSize(p_02);
  pCVar10->nClauses = iVar1 + -1;
  iVar1 = Vec_IntSize(p_03);
  pCVar10->nLiterals = iVar1;
  iVar1 = Vec_IntSize(p_02);
  ppiVar11 = (int **)malloc((long)iVar1 << 3);
  pCVar10->pClauses = ppiVar11;
  piVar12 = Vec_IntReleaseArray(p_03);
  *pCVar10->pClauses = piVar12;
  for (iObj = 0; iVar1 = Vec_IntSize(p_02), iObj < iVar1; iObj = iObj + 1) {
    iVar1 = Vec_IntEntry(p_02,iObj);
    pCVar10->pClauses[iObj] = *pCVar10->pClauses + iVar1;
  }
  Vec_IntFree(p_02);
  Vec_IntFree(p_03);
  return pCVar10;
}

Assistant:

Cnf_Dat_t * Acb_NtkWindow2Cnf( Acb_Ntk_t * p, Vec_Int_t * vWinObjs, int Pivot )
{
    Cnf_Dat_t * pCnf;
    Vec_Int_t * vFaninVars = Vec_IntAlloc( 8 );
    int PivotVar = Vec_IntFind(vWinObjs, Abc_Var2Lit(Pivot, 0));
    int nRoots   = Acb_NtkCountRoots(vWinObjs, PivotVar);
    int TfoStart = PivotVar + 1;
    int nTfoSize = Vec_IntSize(vWinObjs) - TfoStart;
    int nVarsAll = Vec_IntSize(vWinObjs) + nTfoSize + nRoots;
    int i, k, iObj, iObjLit, iFanin, * pFanins, Entry;
    Vec_Wec_t * vCnfs = Acb_DeriveCnfForWindow( p, vWinObjs, PivotVar );
    Vec_Int_t * vClas = Vec_IntAlloc( 100 );
    Vec_Int_t * vLits = Vec_IntAlloc( 1000 );
    // mark new SAT variables
    Vec_IntForEachEntry( vWinObjs, iObj, i )
        Acb_ObjSetFunc( p, Abc_Lit2Var(iObj), i );
    // add clauses for all nodes
    Vec_IntPush( vClas, Vec_IntSize(vLits) );
    Vec_IntForEachEntry( vWinObjs, iObjLit, i )
    {
        if ( Abc_LitIsCompl(iObjLit) && i < PivotVar )
            continue;
        iObj = Abc_Lit2Var(iObjLit);
        assert( !Acb_ObjIsCio(p, iObj) );
        // collect SAT variables
        Vec_IntClear( vFaninVars );
        Acb_ObjForEachFaninFast( p, iObj, pFanins, iFanin, k )
            Vec_IntPush( vFaninVars, Acb_ObjFunc(p, iFanin) );
        Vec_IntPush( vFaninVars, Acb_ObjFunc(p, iObj) );
        // derive CNF for the node
        Acb_TranslateCnf( vClas, vLits, (Vec_Str_t *)Vec_WecEntry(vCnfs, iObj), vFaninVars, -1 );
    }
    // add second clauses for the TFO
    Vec_IntForEachEntryStart( vWinObjs, iObjLit, i, TfoStart )
    {
        iObj = Abc_Lit2Var(iObjLit);
        assert( !Acb_ObjIsCio(p, iObj) );
        // collect SAT variables
        Vec_IntClear( vFaninVars );
        Acb_ObjForEachFaninFast( p, iObj, pFanins, iFanin, k )
            Vec_IntPush( vFaninVars, Acb_ObjFunc(p, iFanin) + (Acb_ObjFunc(p, iFanin) > PivotVar) * nTfoSize );
        Vec_IntPush( vFaninVars, Acb_ObjFunc(p, iObj) + nTfoSize );
        // derive CNF for the node
        Acb_TranslateCnf( vClas, vLits, (Vec_Str_t *)Vec_WecEntry(vCnfs, iObj), vFaninVars, PivotVar );
    }
    if ( nRoots > 0 )
    {
        // create XOR clauses for the roots
        int nVars = Vec_IntSize(vWinObjs) + nTfoSize;
        Vec_IntClear( vFaninVars );
        Vec_IntForEachEntryStart( vWinObjs, iObjLit, i, TfoStart )
        {
            if ( !Abc_LitIsCompl(iObjLit) )
                continue;
            iObj = Abc_Lit2Var(iObjLit);
            // add clauses
            Vec_IntPushThree( vLits, Abc_Var2Lit(Acb_ObjFunc(p, iObj), 1), Abc_Var2Lit(Acb_ObjFunc(p, iObj) + nTfoSize, 0), Abc_Var2Lit(nVars, 0) );
            Vec_IntPush( vClas, Vec_IntSize(vLits) );
            Vec_IntPushThree( vLits, Abc_Var2Lit(Acb_ObjFunc(p, iObj), 0), Abc_Var2Lit(Acb_ObjFunc(p, iObj) + nTfoSize, 1), Abc_Var2Lit(nVars, 0) );
            Vec_IntPush( vClas, Vec_IntSize(vLits) );
            Vec_IntPushThree( vLits, Abc_Var2Lit(Acb_ObjFunc(p, iObj), 0), Abc_Var2Lit(Acb_ObjFunc(p, iObj) + nTfoSize, 0), Abc_Var2Lit(nVars, 1) );
            Vec_IntPush( vClas, Vec_IntSize(vLits) );
            Vec_IntPushThree( vLits, Abc_Var2Lit(Acb_ObjFunc(p, iObj), 1), Abc_Var2Lit(Acb_ObjFunc(p, iObj) + nTfoSize, 1), Abc_Var2Lit(nVars, 1) );
            Vec_IntPush( vClas, Vec_IntSize(vLits) );
            Vec_IntPush( vFaninVars, Abc_Var2Lit(nVars++, 0) );
        }
        Vec_IntAppend( vLits, vFaninVars );
        Vec_IntPush( vClas, Vec_IntSize(vLits) );
        assert( nRoots == Vec_IntSize(vFaninVars) );
        assert( nVars == nVarsAll );
    }
    Vec_IntFree( vFaninVars );
    // create CNF structure
    pCnf = ABC_CALLOC( Cnf_Dat_t, 1 );
    pCnf->nVars     = nVarsAll;
    pCnf->nClauses  = Vec_IntSize(vClas)-1;
    pCnf->nLiterals = Vec_IntSize(vLits);
    pCnf->pClauses  = ABC_ALLOC( int *, Vec_IntSize(vClas) );
    pCnf->pClauses[0] = Vec_IntReleaseArray(vLits);
    Vec_IntForEachEntry( vClas, Entry, i )
        pCnf->pClauses[i] = pCnf->pClauses[0] + Entry;
    // cleanup
    Vec_IntFree( vClas );
    Vec_IntFree( vLits );
    //Cnf_DataPrint( pCnf, 1 );
    return pCnf;
}